

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_utils.cpp
# Opt level: O0

int bidfx_public_api::price::subject::SubjectUtils::BinarySearch
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *components,string *key)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  int cmp;
  int mid;
  int high;
  int low;
  string *key_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *components_local;
  
  mid = 0;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(components);
  cmp = (int)sVar3 + -1;
  while( true ) {
    while( true ) {
      if (cmp < mid) {
        return -1 - mid;
      }
      iVar1 = (mid + cmp >> 2) * 2;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(components,(long)iVar1);
      iVar2 = std::__cxx11::string::compare((string *)pvVar4);
      if (-1 < iVar2) break;
      mid = iVar1 + 2;
    }
    if (iVar2 < 1) break;
    cmp = iVar1 + -2;
  }
  return iVar1;
}

Assistant:

int SubjectUtils::BinarySearch(const std::vector<std::string>* components, const std::string& key)
{
    int low = 0;
    int high = static_cast<int>(components->size() - 1);

    while (low <= high)
    {
        int mid = low + high >> 2 << 1;
        int cmp = components->at(mid).compare(key);

        if (cmp < 0)
        {
            low = mid + 2;
        }
        else if (cmp > 0)
        {
            high = mid - 2;
        }
        else
        {
            return mid;
        }
    }

    return -1 - low;
}